

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

DynamicObject * __thiscall
JsrtDebugManager::SetBreakPoint
          (JsrtDebugManager *this,ScriptContext *scriptContext,Utf8SourceInfo *utf8SourceInfo,
          UINT lineNumber,UINT columnNumber)

{
  StatementLocation statement_00;
  StatementLocation statement_01;
  HRESULT HVar1;
  BOOL BVar2;
  UINT UVar3;
  ulong uVar4;
  size_t sVar5;
  JsrtDebugDocumentManager *this_00;
  Utf8SourceInfo *this_01;
  ScriptContext *scriptContext_00;
  JavascriptLibrary *this_02;
  DynamicObject *pDVar6;
  JsrtDebugPropertyId local_a4;
  DynamicObject *local_a0;
  DynamicObject *bpObject;
  FunctionBody *local_90;
  BreakpointProbe *local_80;
  FunctionBody *local_78;
  BreakpointProbe *local_68;
  BreakpointProbe *probe;
  StatementLocation statement;
  long ibos;
  charcount_t byteOffset;
  charcount_t charPosition;
  DebugDocument *debugDocument;
  UINT columnNumber_local;
  UINT lineNumber_local;
  Utf8SourceInfo *utf8SourceInfo_local;
  ScriptContext *scriptContext_local;
  JsrtDebugManager *this_local;
  
  debugDocument._0_4_ = columnNumber;
  debugDocument._4_4_ = lineNumber;
  _columnNumber_local = utf8SourceInfo;
  utf8SourceInfo_local = (Utf8SourceInfo *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  _byteOffset = Js::Utf8SourceInfo::GetDebugDocument(utf8SourceInfo);
  if (((_byteOffset != (DebugDocument *)0x0) &&
      (HVar1 = Js::Utf8SourceInfo::EnsureLineOffsetCacheNoThrow(_columnNumber_local), -1 < HVar1))
     && (uVar4 = (ulong)debugDocument._4_4_,
        sVar5 = Js::Utf8SourceInfo::GetLineCount(_columnNumber_local), uVar4 < sVar5)) {
    ibos._4_4_ = 0;
    ibos._0_4_ = 0;
    Js::Utf8SourceInfo::GetCharPositionForLineInfo
              (_columnNumber_local,debugDocument._4_4_,(charcount_t *)((long)&ibos + 4),
               (charcount_t *)&ibos);
    statement.bytecodeSpan.begin = ibos._4_4_ + (UINT)debugDocument + 1;
    statement.bytecodeSpan.end = 0;
    Js::StatementLocation::StatementLocation((StatementLocation *)&probe);
    BVar2 = Js::DebugDocument::GetStatementLocation
                      (_byteOffset,statement.bytecodeSpan.begin,(StatementLocation *)&probe);
    if (BVar2 == 0) {
      return (DynamicObject *)0x0;
    }
    local_80 = probe;
    local_78 = statement.function;
    statement_00.bytecodeSpan.end = statement.statement.end;
    statement_00.bytecodeSpan.begin = statement.statement.begin;
    statement_00.statement = (Interval)statement.function;
    statement_00.function = (FunctionBody *)probe;
    local_68 = Js::DebugDocument::FindBreakpoint(_byteOffset,statement_00);
    if (local_68 == (BreakpointProbe *)0x0) {
      bpObject = (DynamicObject *)probe;
      local_90 = statement.function;
      statement_01.bytecodeSpan.end = statement.statement.end;
      statement_01.bytecodeSpan.begin = statement.statement.begin;
      statement_01.statement = (Interval)statement.function;
      statement_01.function = (FunctionBody *)probe;
      local_68 = Js::DebugDocument::SetBreakPoint(_byteOffset,statement_01,BREAKPOINT_ENABLED);
      if (local_68 == (BreakpointProbe *)0x0) {
        return (DynamicObject *)0x0;
      }
      this_00 = GetDebugDocumentManager(this);
      UVar3 = Js::BreakpointProbe::GetId(local_68);
      JsrtDebugDocumentManager::AddDocument(this_00,UVar3,_byteOffset);
    }
    Js::BreakpointProbe::GetStatementLocation(local_68,(StatementLocation *)&probe);
    this_01 = Js::DebugDocument::GetUtf8SourceInfo(_byteOffset);
    scriptContext_00 = Js::Utf8SourceInfo::GetScriptContext(this_01);
    this_02 = Js::ScriptContext::GetLibrary((ScriptContext *)utf8SourceInfo_local);
    pDVar6 = Js::JavascriptLibrary::CreateObject(this_02,false,0);
    pDVar6 = (DynamicObject *)Js::CrossSite::MarshalVar(scriptContext_00,pDVar6,false);
    local_a0 = pDVar6;
    JsrtDebugPropertyId::JsrtDebugPropertyId(&local_a4,breakpointId);
    UVar3 = Js::BreakpointProbe::GetId(local_68);
    JsrtDebugUtils::AddPropertyToObject(pDVar6,local_a4,UVar3,(ScriptContext *)utf8SourceInfo_local)
    ;
    JsrtDebugUtils::AddLineColumnToObject(local_a0,(FunctionBody *)probe,statement.statement.begin);
    JsrtDebugUtils::AddScriptIdToObject(local_a0,_columnNumber_local);
    return local_a0;
  }
  return (DynamicObject *)0x0;
}

Assistant:

Js::DynamicObject* JsrtDebugManager::SetBreakPoint(Js::ScriptContext* scriptContext, Js::Utf8SourceInfo* utf8SourceInfo, UINT lineNumber, UINT columnNumber)
{
    Js::DebugDocument* debugDocument = utf8SourceInfo->GetDebugDocument();
    if (debugDocument != nullptr && SUCCEEDED(utf8SourceInfo->EnsureLineOffsetCacheNoThrow()) && lineNumber < utf8SourceInfo->GetLineCount())
    {
        charcount_t charPosition = 0;
        charcount_t byteOffset = 0;
        utf8SourceInfo->GetCharPositionForLineInfo((charcount_t)lineNumber, &charPosition, &byteOffset);
        long ibos = charPosition + columnNumber + 1;

        Js::StatementLocation statement;
        if (!debugDocument->GetStatementLocation(ibos, &statement))
        {
            return nullptr;
        }

        // Don't see a use case for supporting multiple breakpoints at same location.
        // If a breakpoint already exists, just return that
        Js::BreakpointProbe* probe = debugDocument->FindBreakpoint(statement);
        if (probe == nullptr)
        {
            probe = debugDocument->SetBreakPoint(statement, BREAKPOINT_ENABLED);

            if(probe == nullptr)
            {
                return nullptr;
            }

            this->GetDebugDocumentManager()->AddDocument(probe->GetId(), debugDocument);
        }

        probe->GetStatementLocation(&statement);

        Js::DynamicObject* bpObject = (Js::DynamicObject*)Js::CrossSite::MarshalVar(debugDocument->GetUtf8SourceInfo()->GetScriptContext(), scriptContext->GetLibrary()->CreateObject());

        JsrtDebugUtils::AddPropertyToObject(bpObject, JsrtDebugPropertyId::breakpointId, probe->GetId(), scriptContext);
        JsrtDebugUtils::AddLineColumnToObject(bpObject, statement.function, statement.bytecodeSpan.begin);
        JsrtDebugUtils::AddScriptIdToObject(bpObject, utf8SourceInfo);

        return bpObject;
    }

    return nullptr;
}